

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-stm.c
# Opt level: O2

int lcopy(lua_State *L)

{
  rwlock *prVar1;
  int iVar2;
  rwlock *lock;
  undefined8 *puVar3;
  
  puVar3 = (undefined8 *)lua_touserdata(L,1);
  lock = (rwlock *)*puVar3;
  rwlock_rlock(lock);
  LOCK();
  prVar1 = lock + 1;
  iVar2 = prVar1->write;
  prVar1->write = prVar1->write + 1;
  UNLOCK();
  LOCK();
  lock->read = lock->read + -1;
  UNLOCK();
  if (0 < iVar2) {
    lua_pushlightuserdata(L,(void *)*puVar3);
    return 1;
  }
  __assert_fail("ref > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-stm.c"
                ,0x58,"void stm_grab(struct stm_object *)");
}

Assistant:

static int
lcopy(lua_State *L) {
	struct boxstm * box = lua_touserdata(L, 1);
	stm_grab(box->obj);
	lua_pushlightuserdata(L, box->obj);
	return 1;
}